

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O0

int jpc_qcc_putparms(jpc_ms_t *ms,jpc_cstate_t *cstate,jas_stream_t *out)

{
  int iVar1;
  jpc_qcc_t *qcc;
  jas_stream_t *out_local;
  jpc_cstate_t *cstate_local;
  jpc_ms_t *ms_local;
  
  if (cstate->numcomps < 0x101) {
    iVar1 = jpc_putuint8(out,(uint_fast8_t)(ms->parms).sot.tileno);
    if (iVar1 != 0) {
      return -1;
    }
  }
  else {
    iVar1 = jpc_putuint16(out,(ms->parms).sot.tileno);
    if (iVar1 != 0) {
      return -1;
    }
  }
  iVar1 = jpc_qcx_putcompparms((jpc_qcxcp_t *)&(ms->parms).qcd.compparms.stepsizes,cstate,out);
  if (iVar1 == 0) {
    ms_local._4_4_ = 0;
  }
  else {
    ms_local._4_4_ = -1;
  }
  return ms_local._4_4_;
}

Assistant:

static int jpc_qcc_putparms(jpc_ms_t *ms, jpc_cstate_t *cstate, jas_stream_t *out)
{
	jpc_qcc_t *qcc = &ms->parms.qcc;
	if (cstate->numcomps <= 256) {
		if (jpc_putuint8(out, qcc->compno)) {
			return -1;
		}
	} else {
		if (jpc_putuint16(out, qcc->compno)) {
			return -1;
		}
	}
	if (jpc_qcx_putcompparms(&qcc->compparms, cstate, out)) {
		return -1;
	}
	return 0;
}